

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Cluster * __thiscall mkvparser::Segment::FindCluster(Segment *this,longlong time_ns)

{
  longlong lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Cluster *pCVar5;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    pCVar5 = &this->m_eos;
  }
  else {
    pCVar5 = *this->m_clusters;
    if (pCVar5 == (Cluster *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xc64,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
    }
    if (pCVar5->m_index != 0) {
      __assert_fail("pCluster->m_index == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xc65,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
    }
    lVar1 = Cluster::GetTime(pCVar5);
    if (lVar1 < time_ns) {
      lVar3 = 0;
      lVar4 = this->m_clusterCount;
      while( true ) {
        lVar2 = lVar4 - lVar3;
        if (lVar2 == 0 || lVar4 < lVar3) break;
        lVar2 = lVar2 / 2 + lVar3;
        if (this->m_clusterCount <= lVar2) {
          __assert_fail("k < m_clusterCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc77,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
        pCVar5 = this->m_clusters[lVar2];
        if (pCVar5 == (Cluster *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc7a,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
        if (pCVar5->m_index != lVar2) {
          __assert_fail("pCluster->m_index == k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc7b,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
        lVar1 = Cluster::GetTime(pCVar5);
        if (lVar1 <= time_ns) {
          lVar3 = lVar2 + 1;
          lVar2 = lVar4;
        }
        lVar4 = lVar2;
        if (lVar2 < lVar3) {
          __assert_fail("i <= j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xc84,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
        }
      }
      if (lVar2 != 0) {
        __assert_fail("i == j",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc87,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      if (lVar3 < 1) {
        __assert_fail("i > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc88,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      if (this->m_clusterCount < lVar3) {
        __assert_fail("i <= m_clusterCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc89,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      pCVar5 = this->m_clusters[lVar3 + -1];
      if (pCVar5 == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc8e,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      if (pCVar5->m_index != lVar3 + -1) {
        __assert_fail("pCluster->m_index == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc8f,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
      lVar1 = Cluster::GetTime(pCVar5);
      if (time_ns < lVar1) {
        __assert_fail("pCluster->GetTime() <= time_ns",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xc90,"const Cluster *mkvparser::Segment::FindCluster(long long) const");
      }
    }
  }
  return pCVar5;
}

Assistant:

const Cluster* Segment::FindCluster(long long time_ns) const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  {
    Cluster* const pCluster = m_clusters[0];
    assert(pCluster);
    assert(pCluster->m_index == 0);

    if (time_ns <= pCluster->GetTime())
      return pCluster;
  }

  // Binary search of cluster array

  long i = 0;
  long j = m_clusterCount;

  while (i < j) {
    // INVARIANT:
    //[0, i) <= time_ns
    //[i, j) ?
    //[j, m_clusterCount)  > time_ns

    const long k = i + (j - i) / 2;
    assert(k < m_clusterCount);

    Cluster* const pCluster = m_clusters[k];
    assert(pCluster);
    assert(pCluster->m_index == k);

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    assert(i <= j);
  }

  assert(i == j);
  assert(i > 0);
  assert(i <= m_clusterCount);

  const long k = i - 1;

  Cluster* const pCluster = m_clusters[k];
  assert(pCluster);
  assert(pCluster->m_index == k);
  assert(pCluster->GetTime() <= time_ns);

  return pCluster;
}